

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O1

void ngram_fwdflat_finish(ngram_search_t *ngs)

{
  int iVar1;
  double dVar2;
  uint uVar3;
  chan_t *elem;
  chan_s *pcVar4;
  ps_latnode_s *ppVar5;
  ps_latnode_t *elem_00;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  uVar6 = *ngs->fwdflat_wordlist;
  if (-1 < (int)uVar6) {
    lVar8 = 4;
    do {
      if (((ngs->base).dict)->word[uVar6].pronlen != 1) {
        elem = ngs->word_chan[uVar6];
        if (elem == (chan_t *)0x0) {
          __assert_fail("ngs->word_chan[wid] != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                        ,0x38e,"void destroy_fwdflat_chan(ngram_search_t *)");
        }
        pcVar4 = elem->next;
        __listelem_free__(ngs->root_chan_alloc,elem,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                          ,0x397);
        ngs->word_chan[uVar6] = pcVar4;
        ngram_search_free_all_rc(ngs,uVar6);
      }
      uVar6 = *(uint *)((long)ngs->fwdflat_wordlist + lVar8);
      lVar8 = lVar8 + 4;
    } while (-1 < (int)uVar6);
  }
  if ((ngs->fwdtree != '\0') && (0 < ngs->n_frame)) {
    lVar8 = 0;
    do {
      elem_00 = ngs->frm_wordlist[lVar8];
      while (elem_00 != (ps_latnode_t *)0x0) {
        ppVar5 = elem_00->next;
        __listelem_free__(ngs->latnode_alloc,elem_00,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                          ,0x37b);
        elem_00 = ppVar5;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < ngs->n_frame);
  }
  iVar7 = (ngs->base).n_words;
  iVar1 = iVar7 + 0x1f;
  iVar7 = iVar7 + 0x3e;
  if (-1 < iVar1) {
    iVar7 = iVar1;
  }
  memset(ngs->word_active,0,(long)(iVar7 >> 5) << 2);
  uVar6 = ((ngs->base).acmod)->output_frame;
  ngram_search_mark_bptable(ngs,uVar6);
  ptmr_stop(&ngs->fwdflat_perf);
  if ((int)uVar6 < 1) {
    return;
  }
  iVar1 = uVar6 + 1;
  lVar8 = ps_config_int((ngs->base).config,"frate");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
          ,0x3b1,"%8d words recognized (%d/fr)\n",(ulong)(uint)ngs->bpidx,
          (long)(int)(ngs->bpidx + (uVar6 >> 1)) / (long)iVar1 & 0xffffffff);
  uVar3 = (ngs->st).n_senone_active_utt;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
          ,0x3b3,"%8d senones evaluated (%d/fr)\n",(ulong)uVar3,
          (long)(int)((uVar6 >> 1) + uVar3) / (long)iVar1 & 0xffffffff);
  uVar6 = (ngs->st).n_fwdflat_chan;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
          ,0x3b5,"%8d channels searched (%d/fr)\n",(ulong)uVar6,
          (long)(int)uVar6 / (long)iVar1 & 0xffffffff);
  uVar6 = (ngs->st).n_fwdflat_words;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
          ,0x3b7,"%8d words searched (%d/fr)\n",(ulong)uVar6,
          (long)(int)uVar6 / (long)iVar1 & 0xffffffff);
  uVar6 = (ngs->st).n_fwdflat_word_transition;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
          ,0x3ba,"%8d word transitions (%d/fr)\n",(ulong)uVar6,
          (long)(int)uVar6 / (long)iVar1 & 0xffffffff);
  dVar2 = (double)(ngs->fwdflat_perf).t_cpu;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
          ,0x3bd,"fwdflat %.2f CPU %.3f xRT\n",dVar2,dVar2 / ((double)iVar1 / (double)lVar8));
  dVar2 = (double)(ngs->fwdflat_perf).t_elapsed;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
          ,0x3c0,"fwdflat %.2f wall %.3f xRT\n",dVar2,dVar2 / ((double)iVar1 / (double)lVar8));
  return;
}

Assistant:

void
ngram_fwdflat_finish(ngram_search_t *ngs)
{
    int32 cf;

    destroy_fwdflat_chan(ngs);
    destroy_fwdflat_wordlist(ngs);
    bitvec_clear_all(ngs->word_active, ps_search_n_words(ngs));

    /* This is the number of frames processed. */
    cf = ps_search_acmod(ngs)->output_frame;
    /* Add a mark in the backpointer table for one past the final frame. */
    ngram_search_mark_bptable(ngs, cf);

    ptmr_stop(&ngs->fwdflat_perf);
    /* Print out some statistics. */
    if (cf > 0) {
        double n_speech = (double)(cf + 1)
            / ps_config_int(ps_search_config(ngs), "frate");
        E_INFO("%8d words recognized (%d/fr)\n",
               ngs->bpidx, (ngs->bpidx + (cf >> 1)) / (cf + 1));
        E_INFO("%8d senones evaluated (%d/fr)\n", ngs->st.n_senone_active_utt,
               (ngs->st.n_senone_active_utt + (cf >> 1)) / (cf + 1));
        E_INFO("%8d channels searched (%d/fr)\n",
               ngs->st.n_fwdflat_chan, ngs->st.n_fwdflat_chan / (cf + 1));
        E_INFO("%8d words searched (%d/fr)\n",
               ngs->st.n_fwdflat_words, ngs->st.n_fwdflat_words / (cf + 1));
        E_INFO("%8d word transitions (%d/fr)\n",
               ngs->st.n_fwdflat_word_transition,
               ngs->st.n_fwdflat_word_transition / (cf + 1));
        E_INFO("fwdflat %.2f CPU %.3f xRT\n",
               ngs->fwdflat_perf.t_cpu,
               ngs->fwdflat_perf.t_cpu / n_speech);
        E_INFO("fwdflat %.2f wall %.3f xRT\n",
               ngs->fwdflat_perf.t_elapsed,
               ngs->fwdflat_perf.t_elapsed / n_speech);
    }
}